

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

Ver_Bundle_t * Ver_ParseGetNondrivenBundle(Abc_Ntk_t *pNtk,int Counter)

{
  Vec_Ptr_t *p;
  int iVar1;
  void *pvVar2;
  Ver_Bundle_t *pVVar3;
  Abc_Obj_t *pObj;
  int local_40;
  int local_3c;
  int m;
  int k;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pBox;
  Ver_Bundle_t *pBundle;
  int Counter_local;
  Abc_Ntk_t *pNtk_local;
  
  local_3c = 0;
  do {
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNtk->pData);
    if (iVar1 <= local_3c) {
      return (Ver_Bundle_t *)0x0;
    }
    pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)pNtk->pData,local_3c);
    iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 0x40));
    if (Counter < iVar1) {
      p = *(Vec_Ptr_t **)((long)pvVar2 + 0x40);
      iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)((long)pvVar2 + 0x40));
      pVVar3 = (Ver_Bundle_t *)Vec_PtrEntry(p,(iVar1 + -1) - Counter);
      if (pVVar3 != (Ver_Bundle_t *)0x0) {
        for (local_40 = 0; iVar1 = Vec_PtrSize(pVVar3->vNetsActual), local_40 < iVar1;
            local_40 = local_40 + 1) {
          pObj = (Abc_Obj_t *)Vec_PtrEntry(pVVar3->vNetsActual,local_40);
          iVar1 = Abc_ObjFaninNum(pObj);
          if ((iVar1 == 0) &&
             (iVar1 = Ver_ParseFormalNetsAreDriven(pNtk,pVVar3->pNameFormal), iVar1 == 0)) {
            return pVVar3;
          }
        }
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

Ver_Bundle_t * Ver_ParseGetNondrivenBundle( Abc_Ntk_t * pNtk, int Counter )
{
    Ver_Bundle_t * pBundle;
    Abc_Obj_t * pBox, * pNet;
    int k, m;
    // go through instances of this type
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        if ( Counter >= Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // get the bundle given distance away
        pBundle = (Ver_Bundle_t *)Vec_PtrEntry( (Vec_Ptr_t *)pBox->pCopy, Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) - 1 - Counter );
        if ( pBundle == NULL )
            continue;
        // go through the actual nets of this bundle
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNet, m )
            if ( !Abc_ObjFaninNum(pNet) && !Ver_ParseFormalNetsAreDriven(pNtk, pBundle->pNameFormal) ) // non-driven
                return pBundle;
    }
    return NULL;
}